

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

void drawnumber_getbuf(t_drawnumber *x,t_word *data,t_template *template,char *buf)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  int onset;
  int size2;
  char *buf2;
  int local_48;
  int local_44;
  t_atom local_40;
  
  iVar1 = drawnumber_gettype(x,(t_word *)template,(t_template *)&local_48,(int *)buf);
  if (iVar1 < 0) {
    *buf = '\0';
  }
  else {
    strncpy(buf,x->x_label->s_name,0x400);
    buf[0x3ff] = '\0';
    sVar2 = strlen(buf);
    iVar3 = (int)sVar2;
    if (iVar1 == 2) {
      binbuf_gettext(*(_binbuf **)((long)data + (long)local_48),(char **)&local_40,&local_44);
      iVar1 = 0x3ff - iVar3;
      if (local_44 < 0x3ff - iVar3) {
        iVar1 = local_44;
      }
      memcpy(buf + iVar3,(void *)CONCAT44(local_40._4_4_,local_40.a_type),(long)iVar1);
      buf[iVar1 + iVar3] = '\0';
      if (iVar1 + iVar3 == 0x3ff) {
        builtin_strncpy(buf + 0x3fc,"...",4);
      }
      freebytes((void *)CONCAT44(local_40._4_4_,local_40.a_type),(long)local_44);
    }
    else {
      if (iVar1 == 0) {
        local_40.a_type = A_FLOAT;
        local_40.a_w.w_float = (t_float)*(undefined4 *)((long)data + (long)local_48);
      }
      else {
        if (iVar1 == 1) {
          strncpy(buf + iVar3,(char *)**(undefined8 **)((long)data + (long)local_48),
                  (long)(0x400 - iVar3));
          return;
        }
        local_40.a_type = A_SYMBOL;
        local_40.a_w = *(word *)((long)data + (long)local_48);
      }
      atom_string(&local_40,buf + iVar3,0x400 - iVar3);
    }
  }
  return;
}

Assistant:

static void drawnumber_getbuf(t_drawnumber *x, t_word *data,
    t_template *template, char *buf)
{
    int nchars, onset, type = drawnumber_gettype(x, data, template, &onset);
    if (type < 0)
        buf[0] = 0;
    else
    {
        strncpy(buf, x->x_label->s_name, DRAWNUMBER_BUFSIZE);
        buf[DRAWNUMBER_BUFSIZE - 1] = 0;
        nchars = (int)strlen(buf);
        if (type == DT_TEXT)
        {
            char *buf2;
            int size2, ncopy;
            binbuf_gettext(((t_word *)((char *)data + onset))->w_binbuf,
                &buf2, &size2);
            ncopy = (size2 > DRAWNUMBER_BUFSIZE-1-nchars ?
                DRAWNUMBER_BUFSIZE-1-nchars: size2);
            memcpy(buf+nchars, buf2, ncopy);
            buf[nchars+ncopy] = 0;
            if (nchars+ncopy == DRAWNUMBER_BUFSIZE-1)
                strcpy(buf+(DRAWNUMBER_BUFSIZE-4), "...");
            t_freebytes(buf2, size2);
        }
        else
        {
            t_atom at;
            switch(type)
            {
            default:
                SETSYMBOL(&at, ((t_word *)((char *)data + onset))->w_symbol);
                atom_string(&at, buf + nchars, DRAWNUMBER_BUFSIZE - nchars);
                break;
            case DT_FLOAT:
                SETFLOAT(&at, ((t_word *)((char *)data + onset))->w_float);
                atom_string(&at, buf + nchars, DRAWNUMBER_BUFSIZE - nchars);
                break;
            case DT_SYMBOL:
                strncpy(buf + nchars,
                    ((t_word *)((char *)data + onset))->w_symbol->s_name,
                    DRAWNUMBER_BUFSIZE - nchars);
            }
        }
    }
}